

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_tree(REF_INTERP ref_interp,REF_BOOL *increase_fuzz)

{
  REF_GRID pRVar1;
  REF_NODE pRVar2;
  REF_SEARCH pRVar3;
  REF_CELL pRVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  REF_STATUS RVar7;
  ulong uVar8;
  void *pvVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  REF_INT *pRVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uVar13;
  REF_INT RVar14;
  long lVar15;
  void *pvVar16;
  REF_MPI pRVar17;
  long lVar18;
  char *pcVar19;
  REF_INT *pRVar20;
  uint uVar21;
  int iVar22;
  size_t sVar23;
  double dVar24;
  REF_DBL RVar25;
  REF_INT total_node;
  REF_MPI local_198;
  REF_INTERP local_190;
  void *local_188;
  REF_INT *local_180;
  REF_DBL *local_178;
  REF_SEARCH local_170;
  REF_DBL *global_xyz;
  REF_INT *local_160;
  REF_LIST ref_list;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void *local_130;
  int *local_128;
  REF_INT *source;
  REF_INT nrecv;
  REF_GRID local_110;
  REF_NODE local_108;
  REF_DBL *recv_bary;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  void *local_d8;
  REF_CELL local_d0;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  local_198 = ref_interp->ref_mpi;
  pRVar1 = ref_interp->from_grid;
  local_108 = pRVar1->node;
  pRVar2 = ref_interp->to_grid->node;
  pRVar3 = ref_interp->ref_search;
  pRVar4 = (&ref_interp->from_tet)[pRVar1->twod != 0];
  *increase_fuzz = 0;
  uVar6 = ref_list_create(&ref_list);
  uVar8 = (ulong)uVar6;
  if (uVar6 == 0) {
    uVar6 = pRVar2->max;
    uVar8 = 0;
    uVar11 = 0;
    if (0 < (int)uVar6) {
      uVar11 = (ulong)uVar6;
    }
    uVar21 = 0;
    for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      if ((-1 < pRVar2->global[uVar8]) && (pRVar2->ref_mpi->id == pRVar2->part[uVar8])) {
        uVar21 = uVar21 + (ref_interp->cell[uVar8] == -1);
      }
    }
    local_170 = pRVar3;
    local_128 = increase_fuzz;
    local_d0 = pRVar4;
    if ((int)uVar21 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x4a3,"ref_interp_tree","malloc local_node of REF_INT negative");
LAB_0018cf78:
      uVar8 = 1;
      goto LAB_0018d027;
    }
    pvVar9 = malloc((ulong)uVar21 << 2);
    if (pvVar9 == (void *)0x0) {
      pcVar19 = "malloc local_node of REF_INT NULL";
      uVar13 = 0x4a3;
    }
    else {
      local_130 = pvVar9;
      pvVar9 = malloc((ulong)(uVar21 * 3) << 3);
      pRVar17 = local_198;
      if (pvVar9 == (void *)0x0) {
        pcVar19 = "malloc local_xyz of REF_DBL NULL";
        uVar13 = 0x4a4;
      }
      else {
        lVar12 = 8;
        iVar22 = 0;
        for (lVar18 = 0; lVar18 < (int)uVar6; lVar18 = lVar18 + 1) {
          if (((-1 < pRVar2->global[lVar18]) && (pRVar2->ref_mpi->id == pRVar2->part[lVar18])) &&
             (ref_interp->cell[lVar18] == -1)) {
            *(int *)((long)local_130 + (long)iVar22 * 4) = (int)lVar18;
            pRVar5 = pRVar2->real;
            lVar15 = (long)(iVar22 * 3);
            *(undefined8 *)((long)pvVar9 + lVar15 * 8) =
                 *(undefined8 *)((long)pRVar5 + lVar12 * 2 + -0x10);
            *(undefined8 *)((long)pvVar9 + lVar15 * 8 + 8) =
                 *(undefined8 *)((long)pRVar5 + lVar12 * 2 + -8);
            *(undefined8 *)((long)pvVar9 + lVar15 * 8 + 0x10) =
                 *(undefined8 *)((long)pRVar5 + lVar12 * 2);
            iVar22 = iVar22 + 1;
          }
          lVar12 = lVar12 + 0x3c;
        }
        uVar6 = ref_mpi_allconcat(local_198,3,iVar22,pvVar9,&total_node,&source,&global_xyz,3);
        uVar8 = (ulong)uVar6;
        if (uVar6 != 0) {
          pcVar19 = "cat";
          uVar13 = 0x4b1;
          goto LAB_0018ce2a;
        }
        local_110 = pRVar1;
        local_d8 = pvVar9;
        free(source);
        uVar6 = ref_mpi_allconcat(pRVar17,1,iVar22,local_130,&total_node,&source,&global_node,1);
        pRVar1 = local_110;
        if (uVar6 != 0) {
          uVar8 = (ulong)uVar6;
          pcVar19 = "cat";
          uVar13 = 0x4b5;
LAB_0018d0af:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar13,"ref_interp_tree",uVar8,pcVar19);
          goto LAB_0018d027;
        }
        lVar12 = (long)total_node;
        if (lVar12 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x4b7,"ref_interp_tree","malloc best_bary of REF_DBL negative");
          uVar8 = 1;
          goto LAB_0018d027;
        }
        local_178 = (REF_DBL *)malloc(lVar12 * 8);
        if (local_178 == (REF_DBL *)0x0) {
          pcVar19 = "malloc best_bary of REF_DBL NULL";
          uVar13 = 0x4b7;
        }
        else {
          sVar23 = lVar12 << 2;
          local_138 = malloc(sVar23);
          if (local_138 == (void *)0x0) {
            pcVar19 = "malloc best_node of REF_INT NULL";
            uVar13 = 0x4b8;
          }
          else {
            pvVar9 = malloc(sVar23);
            if (pvVar9 == (void *)0x0) {
              pcVar19 = "malloc best_cell of REF_INT NULL";
              uVar13 = 0x4b9;
            }
            else {
              local_160 = (REF_INT *)malloc(sVar23);
              if (local_160 != (REF_INT *)0x0) {
                pvVar16 = (void *)0x0;
                lVar18 = 0;
                lVar12 = 0;
                local_140 = pvVar9;
                while (pvVar9 = local_140, lVar12 < total_node) {
                  *(undefined4 *)((long)local_138 + lVar18) =
                       *(undefined4 *)((long)global_node + lVar18);
                  *(undefined4 *)((long)local_140 + lVar18) = 0xffffffff;
                  *(undefined8 *)((long)local_178 + lVar18 * 2) = 0x4415af1d78b58c40;
                  local_188 = pvVar16;
                  uVar6 = ref_search_touching(local_170,ref_list,
                                              (REF_DBL *)((long)global_xyz + (long)pvVar16),
                                              ref_interp->search_fuzz);
                  uVar8 = (ulong)uVar6;
                  if (uVar6 != 0) {
                    pcVar19 = "tch";
                    uVar13 = 0x4c1;
                    goto LAB_0018ce2a;
                  }
                  pRVar20 = (REF_INT *)((long)pvVar9 + lVar18);
                  if (ref_list->n < 1) {
                    *pRVar20 = -1;
                    goto LAB_0018d24a;
                  }
                  if (pRVar1->twod == 0) {
                    uVar6 = ref_interp_enclosing_tet_in_list
                                      (ref_interp,ref_list,
                                       (REF_DBL *)((long)global_xyz + (long)local_188),pRVar20,bary)
                    ;
                    uVar8 = (ulong)uVar6;
                    if (uVar6 != 0) {
                      pcVar19 = "best in list";
                      uVar13 = 0x4cc;
                      goto LAB_0018ce2a;
                    }
                  }
                  else {
                    uVar6 = ref_interp_enclosing_tri_in_list
                                      (ref_interp,ref_list,
                                       (REF_DBL *)((long)global_xyz + (long)local_188),pRVar20,bary)
                    ;
                    uVar8 = (ulong)uVar6;
                    if (uVar6 != 0) {
                      pcVar19 = "best in list";
                      uVar13 = 0x4c7;
                      goto LAB_0018ce2a;
                    }
                  }
                  if (*pRVar20 != -1) {
                    dVar24 = bary[0];
                    if (bary[1] <= bary[0]) {
                      dVar24 = bary[1];
                    }
                    RVar25 = bary[2];
                    if (bary[3] <= bary[2]) {
                      RVar25 = bary[3];
                    }
                    if (RVar25 <= dVar24) {
                      dVar24 = RVar25;
                    }
                    *(double *)((long)local_178 + lVar18 * 2) = -dVar24;
                  }
LAB_0018d24a:
                  ref_interp->tree_cells = ref_interp->tree_cells + ref_list->n;
                  uVar6 = ref_list_erase(ref_list);
                  uVar8 = (ulong)uVar6;
                  lVar12 = lVar12 + 1;
                  lVar18 = lVar18 + 4;
                  pvVar16 = (void *)((long)local_188 + 0x18);
                  if (uVar6 != 0) goto code_r0x0018d276;
                }
                uVar6 = ref_mpi_allminwho(local_198,local_178,local_160,total_node);
                RVar14 = total_node;
                if (uVar6 != 0) {
                  uVar8 = (ulong)uVar6;
                  pcVar19 = "who";
                  uVar13 = 0x4da;
                  goto LAB_0018ce2a;
                }
                uVar8 = 0;
                uVar11 = 0;
                if (0 < total_node) {
                  uVar11 = (ulong)(uint)total_node;
                }
                uVar6 = 0;
                for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
                  uVar6 = uVar6 + (local_198->id == local_160[uVar8]);
                }
                local_188 = malloc((ulong)(uVar6 * 4) << 3);
                if (local_188 == (void *)0x0) {
                  pcVar19 = "malloc send_bary of REF_DBL NULL";
                  uVar13 = 0x4e0;
                  goto LAB_0018d01d;
                }
                sVar23 = (ulong)uVar6 * 4;
                local_190 = ref_interp;
                local_170 = (REF_SEARCH)malloc(sVar23);
                if (local_170 == (REF_SEARCH)0x0) {
                  pcVar19 = "malloc send_cell of REF_INT NULL";
                  uVar13 = 0x4e1;
                  goto LAB_0018d01d;
                }
                local_148 = malloc(sVar23);
                if (local_148 == (void *)0x0) {
                  pcVar19 = "malloc send_node of REF_INT NULL";
                  uVar13 = 0x4e2;
                  goto LAB_0018d01d;
                }
                local_180 = (REF_INT *)malloc(sVar23);
                if (local_180 == (REF_INT *)0x0) {
                  pcVar19 = "malloc send_proc of REF_INT NULL";
                  uVar13 = 0x4e3;
                  goto LAB_0018d01d;
                }
                local_150 = malloc(sVar23);
                if (local_150 == (void *)0x0) {
                  pcVar19 = "malloc my_proc of REF_INT NULL";
                  uVar13 = 0x4e4;
                  local_150 = (void *)0x0;
                  goto LAB_0018d01d;
                }
                for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
                  *(REF_INT *)((long)local_150 + uVar8 * 4) = local_198->id;
                }
                lVar12 = 0;
                iVar22 = 0;
                pRVar17 = local_198;
                for (lVar18 = 0; lVar18 < RVar14; lVar18 = lVar18 + 1) {
                  if (pRVar17->id == local_160[lVar18]) {
                    lVar15 = (long)iVar22;
                    local_180[lVar15] = source[lVar18];
                    uVar6 = *(uint *)((long)local_138 + lVar18 * 4);
                    *(uint *)((long)local_148 + lVar15 * 4) = uVar6;
                    uVar21 = *(uint *)((long)local_140 + lVar18 * 4);
                    (&local_170->d)[lVar15] = uVar21;
                    if (uVar21 == 0xffffffff) {
                      *local_128 = 1;
                      goto LAB_0018d697;
                    }
                    RVar7 = ref_cell_nodes(local_d0,uVar21,nodes);
                    if (RVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x4f0,"ref_interp_tree",CONCAT44(extraout_var,RVar7),
                             "cell should be set and valid");
                      printf("global %d best cell %d best bary %e\n",local_178[lVar18],(ulong)uVar6,
                             (ulong)uVar21);
                      uVar8 = CONCAT44(extraout_var,RVar7);
                      goto LAB_0018d027;
                    }
                    if (local_110->twod == 0) {
                      uVar6 = ref_node_bary4(local_108,nodes,(REF_DBL *)((long)global_xyz + lVar12),
                                             (REF_DBL *)((long)local_188 + (long)(iVar22 * 4) * 8));
                      uVar8 = (ulong)uVar6;
                      if (uVar6 == 0) goto LAB_0018d697;
                      pcVar19 = "bary";
                      uVar13 = 0x4f9;
                    }
                    else {
                      *(undefined8 *)((long)local_188 + (long)(iVar22 * 4 + 3) * 8) = 0;
                      uVar6 = ref_node_bary3(local_108,nodes,(REF_DBL *)((long)global_xyz + lVar12),
                                             (REF_DBL *)((long)local_188 + (long)(iVar22 * 4) * 8));
                      uVar8 = (ulong)uVar6;
                      if (uVar6 == 0) {
LAB_0018d697:
                        iVar22 = iVar22 + 1;
                        pRVar17 = local_198;
                        RVar14 = total_node;
                        goto LAB_0018d6a3;
                      }
                      pcVar19 = "bary";
                      uVar13 = 0x4f5;
                    }
                    goto LAB_0018ce2a;
                  }
LAB_0018d6a3:
                  lVar12 = lVar12 + 0x18;
                }
                RVar7 = ref_mpi_blindsend(pRVar17,local_180,local_148,1,iVar22,&recv_node,&nrecv,1);
                uVar8 = CONCAT44(extraout_var_00,RVar7);
                if (RVar7 != 0) {
                  pcVar19 = "blind send node";
                  uVar13 = 0x504;
                  goto LAB_0018ce2a;
                }
                RVar7 = ref_mpi_blindsend(local_198,local_180,local_170,1,iVar22,&recv_cell,&nrecv,1
                                         );
                uVar8 = CONCAT44(extraout_var_01,RVar7);
                if (RVar7 != 0) {
                  pcVar19 = "blind send cell";
                  uVar13 = 0x507;
                  goto LAB_0018ce2a;
                }
                uVar6 = ref_mpi_blindsend(local_198,local_180,local_150,1,iVar22,&recv_proc,&nrecv,1
                                         );
                if (uVar6 != 0) {
                  uVar8 = (ulong)uVar6;
                  pcVar19 = "blind send proc";
                  uVar13 = 0x50a;
                  goto LAB_0018d0af;
                }
                uVar6 = ref_mpi_blindsend(local_198,local_180,local_188,4,iVar22,&recv_bary,&nrecv,3
                                         );
                if (uVar6 != 0) {
                  uVar8 = (ulong)uVar6;
                  pcVar19 = "blind send bary";
                  uVar13 = 0x50d;
                  goto LAB_0018d0af;
                }
                pRVar20 = &local_190->n_tree;
                lVar12 = 0;
                for (lVar18 = 0; lVar18 < nrecv; lVar18 = lVar18 + 1) {
                  local_190->n_tree = local_190->n_tree + 1;
                  iVar22 = recv_node[lVar18];
                  pRVar10 = local_190->cell;
                  if ((long)pRVar10[iVar22] != -1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x512,"ref_interp_tree","tree already found?",0xffffffffffffffff,
                           (long)pRVar10[iVar22]);
                    goto LAB_0018cf78;
                  }
                  if (local_190->agent_hired[iVar22] != 0) {
                    uVar6 = ref_agents_delete(local_190->ref_agents,iVar22);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x514,"ref_interp_tree",(ulong)uVar6,"deq");
                      uVar8 = (ulong)uVar6;
                      goto LAB_0018d027;
                    }
                    local_190->agent_hired[iVar22] = 0;
                    pRVar10 = local_190->cell;
                  }
                  pRVar10[iVar22] = recv_cell[lVar18];
                  local_190->part[iVar22] = recv_proc[lVar18];
                  if (recv_cell[lVar18] == -1) {
                    *pRVar20 = *pRVar20 + -1;
                  }
                  else {
                    pRVar5 = local_190->bary;
                    for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
                      pRVar5[(iVar22 << 2) + lVar15] =
                           *(REF_DBL *)((long)recv_bary + lVar15 * 8 + lVar12);
                    }
                  }
                  lVar12 = lVar12 + 0x20;
                }
                uVar6 = ref_mpi_allsum(local_198,pRVar20,1,1);
                uVar8 = (ulong)uVar6;
                if (uVar6 != 0) {
                  pcVar19 = "as";
                  uVar13 = 0x521;
                  goto LAB_0018ce2a;
                }
                uVar6 = ref_mpi_all_or(local_198,local_128);
                uVar8 = (ulong)uVar6;
                if (uVar6 == 0) {
                  free(recv_node);
                  free(recv_cell);
                  free(recv_proc);
                  free(recv_bary);
                  free(local_188);
                  free(local_150);
                  free(local_170);
                  free(local_148);
                  free(local_180);
                  free(local_160);
                  free(local_140);
                  free(local_138);
                  free(local_178);
                  free(source);
                  free(global_node);
                  free(global_xyz);
                  free(local_d8);
                  free(local_130);
                  uVar6 = ref_list_free(ref_list);
                  uVar8 = (ulong)uVar6;
                  if (uVar6 == 0) {
                    uVar8 = 0;
                    if (*local_128 == 0) {
                      uVar8 = (ulong)(uint)pRVar2->max;
                      if (pRVar2->max < 1) {
                        uVar8 = 0;
                      }
                      for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
                        if (((-1 < pRVar2->global[uVar11]) &&
                            (pRVar2->ref_mpi->id == pRVar2->part[uVar11])) &&
                           (local_190->cell[uVar11] == -1)) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x540,"ref_interp_tree","node missed by tree");
                          uVar8 = 1;
                          goto LAB_0018d027;
                        }
                      }
                      uVar8 = 0;
                    }
                    goto LAB_0018d027;
                  }
                  pcVar19 = "free list";
                  uVar13 = 0x53a;
                }
                else {
                  pcVar19 = "sync status";
                  uVar13 = 0x522;
                }
                goto LAB_0018ce2a;
              }
              pcVar19 = "malloc from_proc of REF_INT NULL";
              uVar13 = 0x4ba;
            }
          }
        }
      }
    }
LAB_0018d01d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar13
           ,"ref_interp_tree",pcVar19);
    uVar8 = 2;
    goto LAB_0018d027;
  }
  pcVar19 = "create list";
  uVar13 = 0x49b;
  goto LAB_0018ce2a;
code_r0x0018d276:
  pcVar19 = "reset list";
  uVar13 = 0x4d6;
LAB_0018ce2a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar13,
         "ref_interp_tree",uVar8,pcVar19);
LAB_0018d027:
  return (REF_STATUS)uVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_tree(REF_INTERP ref_interp,
                                          REF_BOOL *increase_fuzz) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_SEARCH ref_search = ref_interp_search(ref_interp);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  *increase_fuzz = REF_FALSE;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }
  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use max*/
    RSS(ref_search_touching(ref_search, ref_list, &(global_xyz[3 * node]),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(from_grid)) {
        RSS(ref_interp_enclosing_tri_in_list(ref_interp, ref_list,
                                             &(global_xyz[3 * node]),
                                             &(best_cell[node]), bary),
            "best in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(ref_interp, ref_list,
                                             &(global_xyz[3 * node]),
                                             &(best_cell[node]), bary),
            "best in list");
      }
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use max*/
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_cell, best_cell[node], nodes),
            "cell should be set and valid", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        if (ref_grid_twod(from_grid)) {
          send_bary[3 + 4 * nsend] = 0.0;
          RSS(ref_node_bary3(from_node, nodes, &(global_xyz[3 * node]),
                             &(send_bary[4 * nsend])),
              "bary");
        } else {
          RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                             &(send_bary[4 * nsend])),
              "bary");
        }
      } else {
        *increase_fuzz =
            REF_TRUE; /* candidate not found, try again larger fuzz */
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
    } else {
      (ref_interp->n_tree)--;
    }
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_tree), 1, REF_INT_TYPE), "as");
  RSS(ref_mpi_all_or(ref_mpi, increase_fuzz), "sync status");

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  if (!(*increase_fuzz)) {
    each_ref_node_valid_node(to_node, node) {
      if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
        continue;
      RUS(REF_EMPTY, ref_interp->cell[node], "node missed by tree");
    }
  }

  return REF_SUCCESS;
}